

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O1

vector<const_char_*,_std::allocator<const_char_*>_> *
EnvProperty::DoDuplicateAndUpdateEnv
          (vector<const_char_*,_std::allocator<const_char_*>_> *__return_storage_ptr__,
          override_set *overrides)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  void *pvVar5;
  char *__dest;
  undefined8 extraout_RAX;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  size_type_conflict __n;
  long lVar9;
  long lVar10;
  char *__dest_00;
  ptrdiff_t _Num;
  size_t *psVar11;
  vector<char_const*,std::allocator<char_const*>> *this;
  char **__args;
  char *local_48;
  char *new_k_and_v;
  vector<char_const*,std::allocator<char_const*>> *local_38;
  
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar8 = *_environ;
  __args = _environ;
  new_k_and_v = (char *)overrides;
  local_38 = (vector<char_const*,std::allocator<char_const*>> *)__return_storage_ptr__;
  do {
    if (pcVar8 == (char *)0x0) {
      pcVar8 = *(char **)new_k_and_v;
      new_k_and_v = *(char **)(new_k_and_v + 8);
      this = local_38;
      if (pcVar8 != new_k_and_v) {
        do {
          if (*(long *)(pcVar8 + 0x28) != 0) {
            uVar7 = *(long *)(pcVar8 + 0x28) + *(long *)(pcVar8 + 8) + 2;
            __dest = (char *)operator_new__(uVar7);
            sVar4 = *(size_t *)(pcVar8 + 8);
            local_48 = __dest;
            if (sVar4 != 0) {
              memmove(__dest,*(void **)pcVar8,sVar4);
            }
            __dest_00 = __dest + sVar4 + 1;
            __dest[sVar4] = '=';
            sVar4 = *(size_t *)(pcVar8 + 0x28);
            if (sVar4 != 0) {
              memmove(__dest_00,*(void **)(pcVar8 + 0x20),sVar4);
            }
            this = local_38;
            __dest_00[sVar4] = '\0';
            if (__dest_00 + sVar4 + 1 != __dest + uVar7) {
              DoDuplicateAndUpdateEnv();
              pvVar5 = *(void **)local_38;
              if (pvVar5 != (void *)0x0) {
                operator_delete(pvVar5,*(long *)(local_38 + 0x10) - (long)pvVar5);
              }
              _Unwind_Resume(extraout_RAX);
            }
            iVar1._M_current = *(char ***)(local_38 + 8);
            if (iVar1._M_current == *(char ***)(local_38 + 0x10)) {
              std::vector<char_const*,std::allocator<char_const*>>::
              _M_realloc_insert<char_const*const&>(local_38,iVar1,&local_48);
            }
            else {
              *iVar1._M_current = __dest;
              *(long *)(local_38 + 8) = *(long *)(local_38 + 8) + 8;
            }
          }
          pcVar8 = pcVar8 + 0x40;
        } while (pcVar8 != new_k_and_v);
      }
      local_48 = (char *)0x0;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                (this,&local_48);
      return (vector<const_char_*,_std::allocator<const_char_*>_> *)this;
    }
    sVar4 = strlen(pcVar8);
    if (sVar4 == 0) {
      uVar7 = 0xffffffffffffffff;
    }
    else {
      pvVar5 = memchr(pcVar8,0x3d,sVar4);
      uVar7 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)pcVar8;
    }
    if (uVar7 == 0xffffffffffffffff) {
      syscall(1,2,"Check failed: pos != std::string_view::npos\n",0x2c);
      abort();
    }
    if (sVar4 < uVar7) {
      uVar7 = sVar4;
    }
    uVar6 = (int)((ulong)(*(long *)(new_k_and_v + 8) - *(long *)new_k_and_v) >> 6) - 1;
    if ((int)uVar6 < 0) {
LAB_00116fda:
      iVar1._M_current = *(char ***)(local_38 + 8);
      if (iVar1._M_current == *(char ***)(local_38 + 0x10)) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  (local_38,iVar1,__args);
      }
      else {
        *iVar1._M_current = pcVar8;
        *(long *)(local_38 + 8) = *(long *)(local_38 + 8) + 8;
      }
    }
    else {
      psVar11 = (size_t *)(*(long *)new_k_and_v + (ulong)uVar6 * 0x40 + 8);
      lVar9 = (ulong)uVar6 + 1;
      do {
        sVar4 = *psVar11;
        if (sVar4 == uVar7) {
          if (sVar4 != 0) {
            iVar3 = bcmp((void *)psVar11[-1],pcVar8,sVar4);
            if (iVar3 != 0) goto LAB_00116fc1;
          }
          iVar3 = (int)lVar9 + -1;
          goto LAB_00116fd5;
        }
LAB_00116fc1:
        psVar11 = psVar11 + -8;
        lVar10 = lVar9 + -1;
        bVar2 = 0 < lVar9;
        lVar9 = lVar10;
      } while (lVar10 != 0 && bVar2);
      iVar3 = -1;
LAB_00116fd5:
      if (iVar3 < 0) goto LAB_00116fda;
    }
    pcVar8 = __args[1];
    __args = __args + 1;
  } while( true );
}

Assistant:

static std::vector<const char*> DoDuplicateAndUpdateEnv(override_set overrides) {
    std::vector<const char*> vec;

    for (const char* const *p = environ; *p; p++) {
      std::string_view k_and_v{*p};
      auto pos = k_and_v.find('=');
      CHECK(pos != std::string_view::npos);
      std::string_view k = k_and_v.substr(0, pos);
      int i = overrides.size() - 1;;
      for (; i >= 0; i--) {
        if (overrides[i].first == k) {
          break;
        }
      }
      if (i < 0) {
        vec.push_back(*p);
      }
    }

    for (const auto& [k, v] : overrides) {
      if (v.empty()) {
        continue;
      }

      size_t sz = k.size() + v.size() + 1 + 1;
      char* new_k_and_v = new char[sz];
      auto it = std::copy(k.begin(), k.end(), new_k_and_v);
      *it++ = '=';
      it = std::copy(v.begin(), v.end(), it);
      *it++ = '\0';
      CHECK_EQ(it, new_k_and_v + sz);

      vec.push_back(new_k_and_v);
    }

    vec.push_back(nullptr);

    return vec;
  }